

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::RemoveShape
          (MutableS2ShapeIndex *this,RemovedShape *removed,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges,InteriorTracker *tracker)

{
  bool bVar1;
  pointer pEVar2;
  double dVar3;
  Edge *removed_edge;
  pointer pEVar4;
  FaceEdge edge;
  FaceEdge local_90;
  
  local_90.edge.v1.c_[1] = 0.0;
  local_90.edge.v1.c_[2] = 0.0;
  local_90.edge.v0.c_[2] = 0.0;
  local_90.edge.v1.c_[0] = 0.0;
  local_90.edge.v0.c_[0] = 0.0;
  local_90.edge.v0.c_[1] = 0.0;
  local_90.b.c_[0] = 0.0;
  local_90.b.c_[1] = 0.0;
  local_90.a.c_[0] = 0.0;
  local_90.a.c_[1] = 0.0;
  local_90.edge_id = -1;
  local_90.shape_id = removed->shape_id;
  local_90.has_interior = removed->has_interior;
  if ((local_90.has_interior == true) &&
     (bVar1 = removed->contains_tracker_origin, tracker->is_active_ = true, bVar1 == true)) {
    InteriorTracker::ToggleShape(tracker,local_90.shape_id);
  }
  pEVar4 = (removed->edges).super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (removed->edges).super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar2) {
    do {
      local_90.edge.v0.c_[0] = (pEVar4->v0).c_[0];
      local_90.edge.v0.c_[1] = (pEVar4->v0).c_[1];
      local_90.edge.v0.c_[2] = (pEVar4->v0).c_[2];
      local_90.edge.v1.c_[0] = (pEVar4->v1).c_[0];
      local_90.edge.v1.c_[1] = (pEVar4->v1).c_[1];
      local_90.edge.v1.c_[2] = (pEVar4->v1).c_[2];
      dVar3 = (local_90.edge.v0.c_[2] - local_90.edge.v1.c_[2]) *
              (local_90.edge.v0.c_[2] - local_90.edge.v1.c_[2]) +
              (local_90.edge.v0.c_[1] - local_90.edge.v1.c_[1]) *
              (local_90.edge.v0.c_[1] - local_90.edge.v1.c_[1]) +
              (local_90.edge.v0.c_[0] - local_90.edge.v1.c_[0]) *
              (local_90.edge.v0.c_[0] - local_90.edge.v1.c_[0]);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      local_90.max_level =
           S2::Metric<1>::GetLevelForMaxValue
                     ((Metric<1> *)&S2::kAvgEdge,
                      dVar3 * FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
      AddFaceEdge(this,&local_90,all_edges);
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar2);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::RemoveShape(const RemovedShape& removed,
                                      vector<FaceEdge> all_edges[6],
                                      InteriorTracker* tracker) const {
  FaceEdge edge;
  edge.edge_id = -1;  // Not used or needed for removed edges.
  edge.shape_id = removed.shape_id;
  edge.has_interior = removed.has_interior;
  if (edge.has_interior) {
    tracker->AddShape(edge.shape_id, removed.contains_tracker_origin);
  }
  for (const auto& removed_edge : removed.edges) {
    edge.edge = removed_edge;
    edge.max_level = GetEdgeMaxLevel(edge.edge);
    AddFaceEdge(&edge, all_edges);
  }
}